

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint __thiscall
ON_SubDComponentList::UpdateSubDForExperts
          (ON_SubDComponentList *this,ON_SubD *subd,bool bUpdateDeletedComponents)

{
  ON_SubD *this_00;
  element_type *peVar1;
  ulong uVar2;
  ON_COMPONENT_INDEX component_index;
  ON_SubDComponentPtr OVar3;
  ON__UINT64 OVar4;
  ON__UINT64 OVar5;
  uint uVar6;
  uint i;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ON_SubDComponentPtr cptr0;
  ON_SubDComponentPtr local_38;
  
  peVar1 = (subd->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    OVar4 = 0;
  }
  else {
    OVar4 = peVar1->RuntimeSerialNumber;
  }
  peVar1 = (this->m_subd).m_subdimple_sp.
           super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    OVar5 = 0;
  }
  else {
    OVar5 = peVar1->RuntimeSerialNumber;
  }
  uVar6 = (this->m_component_list).m_count;
  if (OVar4 != OVar5) {
    this_00 = &this->m_subd;
    uVar9 = 0;
    for (uVar7 = 0; iVar8 = (int)uVar9, uVar6 != uVar7; uVar7 = uVar7 + 1) {
      local_38.m_ptr = (this->m_component_list).m_a[uVar7].m_ptr;
      uVar2 = local_38.m_ptr & 0xfffffffffffffff8;
      uVar10 = uVar9;
      if ((uVar2 != 0 && (local_38.m_ptr & 6) != 0) &&
         ((bUpdateDeletedComponents || ((*(int *)(uVar2 + 8) != 0 && (*(int *)(uVar2 + 0xc) != -1)))
          ))) {
        component_index = ON_SubDComponentPtr::ComponentIndex(&local_38);
        if ((ulong)component_index >> 0x20 != 0) {
          OVar3 = ON_SubD::ComponentPtrFromComponentIndex(subd,component_index);
          if (7 < OVar3.m_ptr && (OVar3.m_ptr & 6) != 0) {
            uVar10 = (ulong)(iVar8 + 1);
            (this->m_component_list).m_a[uVar9].m_ptr = OVar3.m_ptr;
          }
        }
      }
      uVar9 = uVar10;
    }
    if ((-1 < iVar8) && (iVar8 <= (this->m_component_list).m_capacity)) {
      (this->m_component_list).m_count = iVar8;
    }
    ON_SubD::ShareDimple(this_00,subd);
    peVar1 = (this->m_subd).m_subdimple_sp.
             super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 == (element_type *)0x0) {
      OVar4 = 0;
    }
    else {
      OVar4 = peVar1->RuntimeSerialNumber;
    }
    this->m_subd_runtime_serial_number = OVar4;
    OVar4 = ON_SubD::GeometryContentSerialNumber(this_00);
    this->m_subd_geometry_content_serial_number = OVar4;
    OVar4 = ON_SubD::RenderContentSerialNumber(this_00);
    this->m_subd_render_content_serial_number = OVar4;
    uVar6 = (this->m_component_list).m_count;
  }
  return uVar6;
}

Assistant:

unsigned int ON_SubDComponentList::UpdateSubDForExperts(const ON_SubD & subd, bool bUpdateDeletedComponents)
{
  const unsigned count0 = Count();
  if (subd.RuntimeSerialNumber() == m_subd.RuntimeSerialNumber())
    return count0; // the components in this list are in subd.

  // Use the component ids to update the list to reference components in subd.
  unsigned count1 = 0;
  for (unsigned i = 0; i < count0; ++i)
  {
    ON_SubDComponentPtr cptr0 = m_component_list[i];
    const ON_SubDComponentBase* c0 = cptr0.ComponentBase();
    if (nullptr == c0)
      continue;
    if (false == bUpdateDeletedComponents && false == c0->IsActive())
      continue;
    ON_COMPONENT_INDEX ci = cptr0.ComponentIndex();
    if (0 == ci.m_index)
      continue;
    ON_SubDComponentPtr cptr1 = subd.ComponentPtrFromComponentIndex(ci);
    if (cptr1.IsNull())
      continue;
    if (0 != cptr0.ComponentDirection())
      cptr1.SetComponentDirection();
    m_component_list[count1++] = cptr1;
  }
  m_component_list.SetCount(count1);
  m_subd.ShareDimple(subd);
  m_subd_runtime_serial_number = m_subd.RuntimeSerialNumber();
  m_subd_geometry_content_serial_number = m_subd.GeometryContentSerialNumber();
  m_subd_render_content_serial_number = m_subd.RenderContentSerialNumber();
  return Count();
}